

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator*=(TPZFMatrix<long_double> *this,longdouble value)

{
  longdouble *plVar1;
  longdouble *plVar2;
  
  plVar2 = this->fElem;
  plVar1 = plVar2 + (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
                    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  for (; plVar2 < plVar1; plVar2 = plVar2 + 1) {
    *plVar2 = *plVar2 * value;
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator*=( const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ *= value;
    return( *this );
}